

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

char * telnet_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int option;
  _Bool _Var1;
  int iVar2;
  Telnet *telnet;
  Conf *pCVar3;
  strbuf *psVar4;
  char *pcVar5;
  SockAddr *addr;
  char *pcVar6;
  Socket *pSVar7;
  Pinger *pPVar8;
  Opt **ppOVar9;
  size_t sVar10;
  Backend *s;
  Opt *pOVar11;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  Backend **local_58;
  Interactor *local_50;
  Seat *local_48;
  LogContext *local_40;
  char *local_38;
  
  local_58 = backend_handle;
  local_48 = seat;
  local_40 = logctx;
  local_38 = host;
  telnet = (Telnet *)safemalloc(1,200,0);
  memset(telnet,0,200);
  (telnet->plug).vt = &Telnet_plugvt;
  (telnet->backend).vt = vt;
  local_50 = &telnet->interactor;
  (telnet->interactor).vt = &Telnet_interactorvt;
  (telnet->backend).interactor = local_50;
  pCVar3 = conf_copy(conf);
  telnet->conf = pCVar3;
  telnet->s = (Socket *)0x0;
  telnet->socket_connected = false;
  telnet->closed_on_socket_error = false;
  telnet->echoing = true;
  telnet->editing = true;
  telnet->activated = false;
  psVar4 = strbuf_new();
  telnet->sb_buf = psVar4;
  telnet->seat = local_48;
  telnet->logctx = local_40;
  iVar2 = conf_get_int(telnet->conf,0x7d);
  telnet->term_width = iVar2;
  iVar2 = conf_get_int(telnet->conf,0x7e);
  pcVar6 = local_38;
  telnet->term_height = iVar2;
  telnet->state = TOP_LEVEL;
  telnet->ldisc = (Ldisc *)0x0;
  telnet->pinger = (Pinger *)0x0;
  pcVar5 = default_description(vt,local_38,port);
  telnet->description = pcVar5;
  *local_58 = &telnet->backend;
  iVar2 = conf_get_int(telnet->conf,3);
  addr = name_lookup(pcVar6,port,realhost,telnet->conf,iVar2,telnet->logctx,"Telnet connection");
  pcVar6 = sk_addr_error(addr);
  if (pcVar6 == (char *)0x0) {
    iVar2 = 0x17;
    if (-1 < port) {
      iVar2 = port;
    }
    pSVar7 = new_connection(addr,*realhost,iVar2,false,true,nodelay,keepalive,&telnet->plug,
                            telnet->conf,local_50);
    telnet->s = pSVar7;
    pcVar6 = (*pSVar7->vt->socket_error)(pSVar7);
    if (pcVar6 == (char *)0x0) {
      (*telnet->seat->vt->set_trust_status)(telnet->seat,false);
      pPVar8 = pinger_new(telnet->conf,&telnet->backend);
      telnet->pinger = pPVar8;
      _Var1 = conf_get_bool(telnet->conf,0x3d);
      if (_Var1) {
        pOVar11 = &o_naws;
        ppOVar9 = opts;
        do {
          ppOVar9 = ppOVar9 + 1;
          telnet->opt_states[pOVar11->index] = 2;
          pOVar11 = *ppOVar9;
        } while (pOVar11 != (Opt *)0x0);
      }
      else {
        local_58 = (Backend **)realhost;
        pOVar11 = &o_naws;
        ppOVar9 = opts;
        do {
          ppOVar9 = ppOVar9 + 1;
          telnet->opt_states[pOVar11->index] = pOVar11->initial_state;
          if (telnet->opt_states[pOVar11->index] == 0) {
            iVar2 = pOVar11->send;
            option = pOVar11->option;
            local_5b = 0xff;
            local_5a = (undefined1)iVar2;
            local_59 = (undefined1)option;
            sVar10 = (*telnet->s->vt->write)(telnet->s,&local_5b,3);
            telnet->bufsize = sVar10;
            log_option(telnet,"client",iVar2,option);
          }
          pOVar11 = *ppOVar9;
        } while (pOVar11 != (Opt *)0x0);
        telnet->activated = true;
        realhost = (char **)local_58;
      }
      telnet->in_synch = false;
      (*telnet->seat->vt->update_specials_menu)(telnet->seat);
      pcVar6 = conf_get_str(telnet->conf,9);
      if (*pcVar6 != '\0') {
        safefree((Backend *)*realhost);
        s = (Backend *)dupstr(pcVar6);
        *realhost = (char *)s;
        pcVar6 = host_strrchr((char *)s,0x3a);
        if (pcVar6 != (char *)0x0) {
          *pcVar6 = '\0';
        }
      }
      return (char *)0x0;
    }
  }
  else {
    sk_addr_free(addr);
  }
  pcVar6 = dupstr(pcVar6);
  return pcVar6;
}

Assistant:

static char *telnet_init(const BackendVtable *vt, Seat *seat,
                         Backend **backend_handle, LogContext *logctx,
                         Conf *conf, const char *host, int port,
                         char **realhost, bool nodelay, bool keepalive)
{
    SockAddr *addr;
    const char *err;
    Telnet *telnet;
    char *loghost;
    int addressfamily;

    telnet = snew(Telnet);
    memset(telnet, 0, sizeof(Telnet));
    telnet->plug.vt = &Telnet_plugvt;
    telnet->backend.vt = vt;
    telnet->interactor.vt = &Telnet_interactorvt;
    telnet->backend.interactor = &telnet->interactor;
    telnet->conf = conf_copy(conf);
    telnet->s = NULL;
    telnet->socket_connected = false;
    telnet->closed_on_socket_error = false;
    telnet->echoing = true;
    telnet->editing = true;
    telnet->activated = false;
    telnet->sb_buf = strbuf_new();
    telnet->seat = seat;
    telnet->logctx = logctx;
    telnet->term_width = conf_get_int(telnet->conf, CONF_width);
    telnet->term_height = conf_get_int(telnet->conf, CONF_height);
    telnet->state = TOP_LEVEL;
    telnet->ldisc = NULL;
    telnet->pinger = NULL;
    telnet->description = default_description(vt, host, port);
    *backend_handle = &telnet->backend;

    /*
     * Try to find host.
     */
    addressfamily = conf_get_int(telnet->conf, CONF_addressfamily);
    addr = name_lookup(host, port, realhost, telnet->conf, addressfamily,
                       telnet->logctx, "Telnet connection");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 23;                     /* default telnet port */

    /*
     * Open socket.
     */
    telnet->s = new_connection(addr, *realhost, port, false, true, nodelay,
                               keepalive, &telnet->plug, telnet->conf,
                               &telnet->interactor);
    if ((err = sk_socket_error(telnet->s)) != NULL)
        return dupstr(err);

    /* No local authentication phase in this protocol */
    seat_set_trust_status(telnet->seat, false);

    telnet->pinger = pinger_new(telnet->conf, &telnet->backend);

    /*
     * Initialise option states.
     */
    if (conf_get_bool(telnet->conf, CONF_passive_telnet)) {
        const struct Opt *const *o;

        for (o = opts; *o; o++)
            telnet->opt_states[(*o)->index] = INACTIVE;
    } else {
        const struct Opt *const *o;

        for (o = opts; *o; o++) {
            telnet->opt_states[(*o)->index] = (*o)->initial_state;
            if (telnet->opt_states[(*o)->index] == REQUESTED)
                send_opt(telnet, (*o)->send, (*o)->option);
        }
        telnet->activated = true;
    }

    /*
     * Set up SYNCH state.
     */
    telnet->in_synch = false;

    /*
     * We can send special commands from the start.
     */
    seat_update_specials_menu(telnet->seat);

    /*
     * loghost overrides realhost, if specified.
     */
    loghost = conf_get_str(telnet->conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    return NULL;
}